

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MakeCurrentPerfCase::chooseConfig(MakeCurrentPerfCase *this)

{
  deUint32 err;
  deBool dVar1;
  NotSupportedError *this_00;
  uint uVar2;
  uint uVar3;
  allocator<char> local_59;
  string local_58;
  int local_34;
  Library *pLStack_30;
  EGLint configCount;
  Library *egl;
  EGLint attribList [5];
  EGLint surfaceBits;
  MakeCurrentPerfCase *this_local;
  
  uVar2 = 0;
  if (((this->m_spec).surfaceTypes & SURFACETYPE_WINDOW) != 0) {
    uVar2 = 4;
  }
  uVar3 = 0;
  if (((this->m_spec).surfaceTypes & SURFACETYPE_PIXMAP) != 0) {
    uVar3 = 2;
  }
  egl._4_4_ = uVar2 | uVar3 | (uint)(((this->m_spec).surfaceTypes & SURFACETYPE_PBUFFER) != 0);
  egl._0_4_ = 0x3033;
  attribList[0] = 0x3040;
  attribList[1] = 4;
  attribList[2] = 0x3038;
  attribList[3] = egl._4_4_;
  unique0x100001a9 = this;
  pLStack_30 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_34 = 0;
  do {
    (*pLStack_30->_vptr_Library[2])(pLStack_30,this->m_display,&egl,&this->m_config,1,&local_34);
    err = (*pLStack_30->_vptr_Library[0x1f])();
    eglu::checkError(err,"chooseConfig(m_display, attribList, &m_config, 1, &configCount)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                     ,0xcf);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  if (local_34 < 1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"No compatible configs found",&local_59);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_58);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::chooseConfig (void)
{
	const EGLint	surfaceBits	= ((m_spec.surfaceTypes & SURFACETYPE_WINDOW) != 0 ? EGL_WINDOW_BIT : 0)
									| ((m_spec.surfaceTypes & SURFACETYPE_PIXMAP) != 0 ? EGL_PIXMAP_BIT : 0)
									| ((m_spec.surfaceTypes & SURFACETYPE_PBUFFER) != 0 ? EGL_PBUFFER_BIT : 0);

	const EGLint	attribList[] = {
		EGL_SURFACE_TYPE,		surfaceBits,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};

	const Library&	egl			= m_eglTestCtx.getLibrary();
	EGLint			configCount = 0;

	EGLU_CHECK_CALL(egl, chooseConfig(m_display, attribList, &m_config, 1, &configCount));

	if (configCount <= 0)
		throw tcu::NotSupportedError("No compatible configs found");
}